

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

char * Extra_FileDesignName(char *pFileName)

{
  char *pcVar1;
  char *pcVar2;
  char *local_30;
  char *pCur;
  char *pStore;
  char *pEnd;
  char *pBeg;
  char *pFileName_local;
  
  for (pStore = pFileName; (pcVar2 = pStore, *pStore != '\0' && (*pStore != '.'));
      pStore = pStore + 1) {
  }
  do {
    pcVar1 = pcVar2;
    pEnd = pcVar1 + -1;
    if (pEnd < pFileName) break;
  } while (((('`' < *pEnd) && (pcVar2 = pEnd, *pEnd < '{')) ||
           (('@' < *pEnd && (pcVar2 = pEnd, *pEnd < '[')))) ||
          ((('/' < *pEnd && (pcVar2 = pEnd, *pEnd < ':')) || (pcVar2 = pEnd, *pEnd == '_'))));
  pcVar2 = (char *)malloc((size_t)(pStore + (1 - (long)pcVar1)));
  local_30 = pcVar2;
  for (pEnd = pcVar1; pEnd < pStore; pEnd = pEnd + 1) {
    *local_30 = *pEnd;
    local_30 = local_30 + 1;
  }
  *local_30 = '\0';
  return pcVar2;
}

Assistant:

char * Extra_FileDesignName( char * pFileName )
{
    char * pBeg, * pEnd, * pStore, * pCur;
    // find the first dot
    for ( pEnd = pFileName; *pEnd; pEnd++ )
        if ( *pEnd == '.' )
            break;
    // find the first char
    for ( pBeg = pEnd - 1; pBeg >= pFileName; pBeg-- )
        if ( !((*pBeg >= 'a' && *pBeg <= 'z') || (*pBeg >= 'A' && *pBeg <= 'Z') || (*pBeg >= '0' && *pBeg <= '9') || *pBeg == '_') )
            break;
    pBeg++;
    // fill up storage
    pStore = ABC_ALLOC( char, pEnd - pBeg + 1 );
    for ( pCur = pStore; pBeg < pEnd; pBeg++, pCur++ )
        *pCur = *pBeg;
    *pCur = 0;
    return pStore;
}